

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void __thiscall
CharConvUCS2L::pad(CharConvUCS2L *this,CVmDataSource *dst,char ch,long str_bytes,CVmPackType *t)

{
  int iVar1;
  
  if (t->count_in_bytes == 0) {
    iVar1 = (**(code **)((long)*this + 0x18))(this,t);
  }
  else {
    iVar1 = 1;
    if (-1 < t->count) {
      iVar1 = t->count;
    }
  }
  CVmPack::write_padding(dst,ch,'\0',iVar1 - str_bytes);
  return;
}

Assistant:

virtual void pad(CVmDataSource *dst, char ch, long str_bytes,
                     const CVmPackType *t)
        { CVmPack::write_padding(dst, ch, 0, get_byte_count(t) - str_bytes); }